

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  __m256i *palVar2;
  undefined8 *puVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  uint uVar8;
  void *pvVar9;
  parasail_matrix_t *ppVar10;
  void *pvVar11;
  void *pvVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i c;
  __m256i c_00;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  __m256i *palVar22;
  __m256i *ptr;
  __m256i *b;
  __m256i *ptr_00;
  __m256i *b_00;
  __m256i *ptr_01;
  __m256i *b_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  int64_t *ptr_04;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  longlong lVar30;
  undefined8 uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  longlong lVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  long lVar45;
  longlong lVar46;
  int iVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  ulong size;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  bool bVar66;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ulong uVar67;
  undefined1 auVar77 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined8 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  int iVar123;
  __m256i *local_3c0;
  __m256i *local_3b0;
  __m256i *local_390;
  __m256i *local_388;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar78 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar9 = (profile->profile64).score;
    if (pvVar9 == (void *)0x0) {
      parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar10 = profile->matrix;
      if (ppVar10 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_4();
        }
        else {
          uVar55 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_1();
          }
          else {
            iVar18 = uVar8 - 1;
            uVar1 = (ulong)uVar8 + 3;
            size = uVar1 >> 2;
            uVar62 = (uint)size;
            iVar19 = iVar18 / (int)uVar62;
            uVar41 = iVar18 % (int)uVar62;
            uVar34 = CONCAT44(0,open);
            iVar47 = -open;
            iVar32 = ppVar10->min;
            pvVar11 = (profile->profile64).matches;
            pvVar12 = (profile->profile64).similar;
            uVar44 = 0x8000000000000000 - (long)iVar32;
            if (iVar32 != iVar47 && SBORROW4(iVar32,iVar47) == iVar32 + open < 0) {
              uVar44 = uVar34 | 0x8000000000000000;
            }
            iVar32 = ppVar10->max;
            ppVar21 = parasail_result_new_table3((uint)uVar1 & 0x7ffffffc,s2Len);
            if (ppVar21 != (parasail_result_t *)0x0) {
              ppVar21->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x4830802;
              palVar22 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              b = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              ptr_04 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_04 != (int64_t *)0x0 && b_04 != (__m256i *)0x0) &&
                  ((b_03 != (__m256i *)0x0 &&
                   (b_02 != (__m256i *)0x0 && (ptr_03 != (__m256i *)0x0 && ptr_02 != (__m256i *)0x0)
                   )) && ((b_01 != (__m256i *)0x0 &&
                          (ptr_01 != (__m256i *)0x0 && b_00 != (__m256i *)0x0)) &&
                         ((ptr_00 != (__m256i *)0x0 && b != (__m256i *)0x0) &&
                         (ptr != (__m256i *)0x0 && palVar22 != (__m256i *)0x0))))) {
                iVar20 = s2Len + -1;
                iVar42 = 3 - iVar19;
                uVar53 = CONCAT44(0,gap);
                auVar77._8_4_ = gap;
                auVar77._0_8_ = uVar53;
                auVar77._12_4_ = 0;
                auVar77._16_4_ = gap;
                auVar77._20_4_ = 0;
                auVar77._24_4_ = gap;
                auVar77._28_4_ = 0;
                lVar35 = uVar44 + 1;
                lVar57 = 0x7ffffffffffffffe - (long)iVar32;
                alVar4[1] = (longlong)b_00;
                alVar4[0] = in_stack_fffffffffffffc00;
                alVar4[2]._0_4_ = in_stack_fffffffffffffc10;
                alVar4[2]._4_4_ = in_stack_fffffffffffffc14;
                alVar4[3] = lVar35;
                lVar61 = lVar35;
                parasail_memset___m256i(b,alVar4,size);
                alVar5[1] = (longlong)b_00;
                alVar5[0] = in_stack_fffffffffffffc00;
                alVar5[2]._0_4_ = in_stack_fffffffffffffc10;
                alVar5[2]._4_4_ = in_stack_fffffffffffffc14;
                alVar5[3] = lVar61;
                parasail_memset___m256i(b_00,alVar5,size);
                alVar6[1] = (longlong)b_00;
                alVar6[0] = in_stack_fffffffffffffc00;
                alVar6[2]._0_4_ = in_stack_fffffffffffffc10;
                alVar6[2]._4_4_ = in_stack_fffffffffffffc14;
                alVar6[3] = lVar61;
                parasail_memset___m256i(b_01,alVar6,size);
                alVar7[1] = (longlong)b_00;
                alVar7[0] = in_stack_fffffffffffffc00;
                alVar7[2]._0_4_ = in_stack_fffffffffffffc10;
                alVar7[2]._4_4_ = in_stack_fffffffffffffc14;
                alVar7[3] = lVar61;
                parasail_memset___m256i(b_02,alVar7,size);
                c[1] = (longlong)b_00;
                c[0] = in_stack_fffffffffffffc00;
                c[2]._0_4_ = in_stack_fffffffffffffc10;
                c[2]._4_4_ = in_stack_fffffffffffffc14;
                c[3] = lVar61;
                parasail_memset___m256i(b_03,c,size);
                c_00[1] = (longlong)b_00;
                c_00[0] = in_stack_fffffffffffffc00;
                c_00[2]._0_4_ = in_stack_fffffffffffffc10;
                c_00[2]._4_4_ = in_stack_fffffffffffffc14;
                c_00[3] = lVar61;
                parasail_memset___m256i(b_04,c_00,size);
                lVar23 = (long)iVar47;
                uVar44 = 0;
                do {
                  lVar54 = 0;
                  lVar51 = lVar23;
                  do {
                    lVar59 = lVar51;
                    if (s1_beg != 0) {
                      lVar59 = 0;
                    }
                    local_80[lVar54] = lVar59;
                    local_a0[lVar54] = lVar59 - uVar34;
                    lVar54 = lVar54 + 1;
                    lVar51 = lVar51 - size * uVar53;
                  } while (lVar54 != 4);
                  palVar2 = palVar22 + uVar44;
                  (*palVar2)[0] = local_80[0];
                  (*palVar2)[1] = local_80[1];
                  (*palVar2)[2] = local_80[2];
                  (*palVar2)[3] = local_80[3];
                  palVar2 = ptr_03 + uVar44;
                  (*palVar2)[0] = local_a0[0];
                  (*palVar2)[1] = local_a0[1];
                  (*palVar2)[2] = local_a0[2];
                  (*palVar2)[3] = local_a0[3];
                  uVar44 = uVar44 + 1;
                  lVar23 = lVar23 - uVar53;
                } while (uVar44 != size);
                *ptr_04 = 0;
                uVar44 = 1;
                iVar32 = iVar47;
                do {
                  iVar56 = 0;
                  if (s2_beg == 0) {
                    iVar56 = iVar32;
                  }
                  ptr_04[uVar44] = (long)iVar56;
                  uVar44 = uVar44 + 1;
                  iVar32 = iVar32 - gap;
                } while (s2Len + 1 != uVar44);
                uVar49 = uVar62 - 1;
                uVar44 = 1;
                if (1 < s2Len) {
                  uVar44 = uVar55;
                }
                lVar51 = size * uVar55;
                lVar23 = lVar51 * 4;
                lVar64 = lVar51 * 8;
                lVar51 = lVar51 * 0xc;
                lVar54 = (ulong)(uVar62 + (uVar62 == 0)) << 5;
                lVar59 = 0;
                uVar53 = 0;
                auVar81._8_8_ = lVar35;
                auVar81._0_8_ = lVar35;
                auVar81._16_8_ = lVar35;
                auVar81._24_8_ = lVar35;
                auVar116 = ZEXT3264(auVar81);
                auVar94 = ZEXT3264(auVar81);
                auVar101 = ZEXT3264(auVar81);
                auVar108 = ZEXT3264(auVar81);
                auVar110 = ZEXT3264(auVar81);
                auVar113 = ZEXT3264(CONCAT824(lVar57,CONCAT816(lVar57,CONCAT88(lVar57,lVar57))));
                iVar32 = iVar20;
                do {
                  local_388 = ptr_00;
                  local_390 = ptr_01;
                  local_3b0 = ptr;
                  local_3c0 = ptr_02;
                  ptr_01 = b_00;
                  ptr = palVar22;
                  ptr_00 = b;
                  ptr_02 = b_01;
                  alVar4 = ptr[uVar49];
                  alVar5 = ptr_00[uVar49];
                  alVar6 = ptr_01[uVar49];
                  alVar7 = ptr_02[uVar49];
                  auVar68 = alVar4._0_16_;
                  auVar106._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar68;
                  auVar106._16_16_ = ZEXT116(0) * alVar4._16_16_ + ZEXT116(1) * auVar68;
                  auVar81 = vpalignr_avx2((undefined1  [32])alVar4,auVar106,8);
                  auVar106 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  auVar106 = vpalignr_avx2((undefined1  [32])alVar5,auVar106,8);
                  auVar14 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                  auVar14 = vpalignr_avx2((undefined1  [32])alVar6,auVar14,8);
                  auVar117 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,8);
                  auVar117 = vpalignr_avx2((undefined1  [32])alVar7,auVar117,8);
                  auVar81 = vpblendd_avx2(auVar81,ZEXT832((ulong)ptr_04[uVar53]),3);
                  lVar36 = (long)ppVar10->mapper[(byte)s2[uVar53]] * size * 0x20;
                  auVar118 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT3264(CONCAT824(1,CONCAT816(1,CONCAT88(1,1))));
                  auVar119 = ZEXT864(0) << 0x40;
                  lVar45 = 0;
                  lVar58 = lVar59;
                  auVar120 = ZEXT3264(CONCAT824(lVar35,CONCAT816(lVar35,CONCAT88(lVar35,lVar35))));
                  do {
                    auVar81 = vpaddq_avx2(auVar81,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar45 + lVar36));
                    auVar79 = *(undefined1 (*) [32])((long)*ptr_03 + lVar45);
                    uVar39 = auVar81._0_8_;
                    uVar28 = *(ulong *)((long)*ptr_03 + lVar45);
                    if ((long)uVar28 < (long)uVar39) {
                      uVar28 = uVar39;
                    }
                    uVar24 = vpextrq_avx(auVar81._0_16_,1);
                    uVar52 = *(ulong *)((long)*ptr_03 + lVar45 + 8);
                    if ((long)uVar52 < (long)uVar24) {
                      uVar52 = uVar24;
                    }
                    uVar48 = auVar81._16_8_;
                    uVar24 = *(ulong *)((long)*ptr_03 + lVar45 + 0x10);
                    if ((long)uVar24 < (long)uVar48) {
                      uVar24 = uVar48;
                    }
                    uVar25 = vpextrq_avx(auVar81._16_16_,1);
                    uVar29 = *(ulong *)((long)*ptr_03 + lVar45 + 0x18);
                    if ((long)uVar29 < (long)uVar25) {
                      uVar29 = uVar25;
                    }
                    uVar25 = auVar120._0_8_;
                    if ((long)uVar28 <= (long)uVar25) {
                      uVar28 = uVar25;
                    }
                    auVar87 = *(undefined1 (*) [32])((long)*b_04 + lVar45);
                    uVar26 = vpextrq_avx(auVar120._0_16_,1);
                    if ((long)uVar52 <= (long)uVar26) {
                      uVar52 = uVar26;
                    }
                    uVar26 = auVar120._16_8_;
                    if ((long)uVar24 <= (long)uVar26) {
                      uVar24 = uVar26;
                    }
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = uVar52;
                    auVar102._8_8_ = 0;
                    auVar102._0_8_ = uVar28;
                    auVar68 = vpunpcklqdq_avx(auVar102,auVar68);
                    uVar27 = vpextrq_avx(auVar120._16_16_,1);
                    if ((long)uVar29 <= (long)uVar27) {
                      uVar29 = uVar27;
                    }
                    auVar69._8_8_ = 0;
                    auVar69._0_8_ = uVar24;
                    auVar78._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar68;
                    auVar78._16_16_ = ZEXT116(1) * auVar69;
                    auVar93._8_8_ = uVar29;
                    auVar93._0_8_ = uVar29;
                    auVar93._16_8_ = uVar29;
                    auVar93._24_8_ = uVar29;
                    auVar80 = vpblendd_avx2(auVar78,auVar93,0xc0);
                    auVar78 = *(undefined1 (*) [32])((long)*b_02 + lVar45);
                    auVar93 = *(undefined1 (*) [32])((long)*b_03 + lVar45);
                    *(undefined1 (*) [32])((long)*local_3b0 + lVar45) = auVar80;
                    auVar100._0_8_ = -(ulong)(auVar80._0_8_ == uVar39);
                    auVar100._8_8_ = -(ulong)(auVar80._8_8_ == auVar81._8_8_);
                    auVar100._16_8_ = -(ulong)(auVar80._16_8_ == uVar48);
                    auVar100._24_8_ = -(ulong)(auVar80._24_8_ == auVar81._24_8_);
                    auVar107._0_8_ = -(ulong)(auVar80._0_8_ == uVar25);
                    auVar107._8_8_ = -(ulong)(auVar80._8_8_ == auVar120._8_8_);
                    auVar107._16_8_ = -(ulong)(auVar80._16_8_ == uVar26);
                    auVar107._24_8_ = -(ulong)(auVar80._24_8_ == auVar120._24_8_);
                    auVar81 = vblendvpd_avx(auVar78,auVar119._0_32_,auVar107);
                    auVar106 = vpaddq_avx2(auVar106,*(undefined1 (*) [32])
                                                     ((long)pvVar11 + lVar45 + lVar36));
                    auVar81 = vblendvpd_avx(auVar81,auVar106,auVar100);
                    *(undefined1 (*) [32])((long)*local_388 + lVar45) = auVar81;
                    auVar106 = vblendvpd_avx(auVar93,auVar118._0_32_,auVar107);
                    auVar14 = vpaddq_avx2(auVar14,*(undefined1 (*) [32])
                                                   ((long)pvVar12 + lVar45 + lVar36));
                    auVar106 = vblendvpd_avx(auVar106,auVar14,auVar100);
                    *(undefined1 (*) [32])((long)*local_390 + lVar45) = auVar106;
                    auVar14 = vblendvpd_avx(auVar87,auVar122._0_32_,auVar107);
                    auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
                    auVar117 = vpsubq_avx2(auVar117,auVar107);
                    auVar14 = vblendvpd_avx(auVar14,auVar117,auVar100);
                    *(undefined1 (*) [32])((long)*local_3c0 + lVar45) = auVar14;
                    uVar39 = auVar113._0_8_;
                    if ((long)uVar28 <= (long)auVar113._0_8_) {
                      uVar39 = uVar28;
                    }
                    uVar48 = vpextrq_avx(auVar113._0_16_,1);
                    if ((long)uVar52 <= (long)uVar48) {
                      uVar48 = uVar52;
                    }
                    uVar25 = auVar113._16_8_;
                    if ((long)uVar24 <= (long)auVar113._16_8_) {
                      uVar25 = uVar24;
                    }
                    uVar26 = vpextrq_avx(auVar113._16_16_,1);
                    if ((long)uVar29 <= (long)uVar26) {
                      uVar26 = uVar29;
                    }
                    uVar27 = auVar116._0_8_;
                    if ((long)auVar116._0_8_ <= (long)uVar28) {
                      uVar27 = uVar28;
                    }
                    uVar60 = vpextrq_avx(auVar116._0_16_,1);
                    if ((long)uVar60 <= (long)uVar52) {
                      uVar60 = uVar52;
                    }
                    uVar63 = auVar116._16_8_;
                    if ((long)auVar116._16_8_ <= (long)uVar24) {
                      uVar63 = uVar24;
                    }
                    uVar65 = vpextrq_avx(auVar116._16_16_,1);
                    if ((long)uVar65 <= (long)uVar29) {
                      uVar65 = uVar29;
                    }
                    if ((long)uVar27 <= (long)auVar81._0_8_) {
                      uVar27 = auVar81._0_8_;
                    }
                    uVar37 = vpextrq_avx(auVar81._0_16_,1);
                    if ((long)uVar60 <= (long)uVar37) {
                      uVar60 = uVar37;
                    }
                    if ((long)uVar63 <= (long)auVar81._16_8_) {
                      uVar63 = auVar81._16_8_;
                    }
                    uVar37 = vpextrq_avx(auVar81._16_16_,1);
                    if ((long)uVar65 <= (long)uVar37) {
                      uVar65 = uVar37;
                    }
                    if ((long)uVar27 <= (long)auVar106._0_8_) {
                      uVar27 = auVar106._0_8_;
                    }
                    uVar37 = vpextrq_avx(auVar106._0_16_,1);
                    if ((long)uVar60 <= (long)uVar37) {
                      uVar60 = uVar37;
                    }
                    if ((long)uVar63 <= (long)auVar106._16_8_) {
                      uVar63 = auVar106._16_8_;
                    }
                    uVar37 = vpextrq_avx(auVar106._16_16_,1);
                    if ((long)uVar65 <= (long)uVar37) {
                      uVar65 = uVar37;
                    }
                    if ((long)uVar27 <= (long)auVar14._0_8_) {
                      uVar27 = auVar14._0_8_;
                    }
                    uVar37 = vpextrq_avx(auVar14._0_16_,1);
                    if ((long)uVar60 <= (long)uVar37) {
                      uVar60 = uVar37;
                    }
                    if ((long)uVar63 <= (long)auVar14._16_8_) {
                      uVar63 = auVar14._16_8_;
                    }
                    uVar37 = vpextrq_avx(auVar14._16_16_,1);
                    if ((long)uVar65 <= (long)uVar37) {
                      uVar65 = uVar37;
                    }
                    lVar38 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar38 + lVar58) = auVar81._0_4_;
                    lVar38 = lVar38 + lVar58;
                    *(int *)(lVar23 + lVar38) = auVar81._8_4_;
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar26;
                    auVar103._8_8_ = 0;
                    auVar103._0_8_ = uVar25;
                    auVar68 = vpunpcklqdq_avx(auVar103,auVar70);
                    *(int *)(lVar64 + lVar38) = auVar81._16_4_;
                    *(int *)(lVar51 + lVar38) = auVar81._24_4_;
                    lVar38 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar38 + lVar58) = auVar106._0_4_;
                    lVar38 = lVar38 + lVar58;
                    *(int *)(lVar23 + lVar38) = auVar106._8_4_;
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = uVar48;
                    auVar111._8_8_ = 0;
                    auVar111._0_8_ = uVar39;
                    auVar102 = vpunpcklqdq_avx(auVar111,auVar104);
                    *(int *)(lVar64 + lVar38) = auVar106._16_4_;
                    *(int *)(lVar51 + lVar38) = auVar106._24_4_;
                    lVar38 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar38 + lVar58) = auVar14._0_4_;
                    lVar38 = lVar38 + lVar58;
                    *(int *)(lVar23 + lVar38) = auVar14._8_4_;
                    auVar113 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar68,
                                                   ZEXT116(0) * auVar68 + ZEXT116(1) * auVar102));
                    *(int *)(lVar64 + lVar38) = auVar14._16_4_;
                    *(int *)(lVar51 + lVar38) = auVar14._24_4_;
                    lVar38 = *((ppVar21->field_4).trace)->trace_del_table;
                    *(int *)(lVar38 + lVar58) = (int)uVar28;
                    lVar38 = lVar38 + lVar58;
                    auVar117._8_4_ = open;
                    auVar117._0_8_ = uVar34;
                    auVar117._12_4_ = 0;
                    auVar117._16_4_ = open;
                    auVar117._20_4_ = 0;
                    auVar117._24_4_ = open;
                    auVar117._28_4_ = 0;
                    auVar117 = vpsubq_avx2(auVar80,auVar117);
                    auVar79 = vpsubq_avx2(auVar79,auVar77);
                    uVar39 = auVar117._0_8_;
                    uVar28 = auVar79._0_8_;
                    if ((long)auVar79._0_8_ < (long)uVar39) {
                      uVar28 = uVar39;
                    }
                    uVar25 = vpextrq_avx(auVar117._0_16_,1);
                    uVar48 = vpextrq_avx(auVar79._0_16_,1);
                    if ((long)uVar48 < (long)uVar25) {
                      uVar48 = uVar25;
                    }
                    uVar67 = auVar117._16_8_;
                    uVar37 = vpextrq_avx(auVar117._16_16_,1);
                    uVar26 = auVar79._16_8_;
                    if ((long)auVar79._16_8_ < (long)uVar67) {
                      uVar26 = uVar67;
                    }
                    auVar95._8_8_ = 0;
                    auVar95._0_8_ = uVar63;
                    auVar109._8_8_ = 0;
                    auVar109._0_8_ = uVar65;
                    auVar68 = vpunpcklqdq_avx(auVar95,auVar109);
                    uVar63 = vpextrq_avx(auVar79._16_16_,1);
                    if ((long)uVar63 < (long)uVar37) {
                      uVar63 = uVar37;
                    }
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar28;
                    auVar96._8_8_ = 0;
                    auVar96._0_8_ = uVar48;
                    auVar102 = vpunpcklqdq_avx(auVar71,auVar96);
                    auVar107 = vpcmpgtq_avx2(auVar117,auVar79);
                    auVar79 = vblendvpd_avx(auVar78,auVar81,auVar107);
                    auVar78 = vblendvpd_avx(auVar93,auVar106,auVar107);
                    auVar93 = vpcmpeqd_avx2(auVar78,auVar78);
                    auVar80 = vpsubq_avx2(auVar87,auVar93);
                    auVar93 = vpsubq_avx2(auVar14,auVar93);
                    auVar87 = vpcmpeqd_avx2(auVar14,auVar14);
                    auVar14 = vblendvpd_avx(auVar80,auVar93,auVar107);
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = uVar63;
                    auVar114._8_8_ = 0;
                    auVar114._0_8_ = uVar26;
                    auVar69 = vpunpcklqdq_avx(auVar114,auVar72);
                    *(int *)(lVar23 + lVar38) = (int)uVar52;
                    *(int *)(lVar64 + lVar38) = (int)uVar24;
                    *(int *)(lVar51 + lVar38) = (int)uVar29;
                    *(undefined1 (*) [16])((long)*ptr_03 + lVar45 + 0x10) = auVar69;
                    *(undefined1 (*) [16])((long)*ptr_03 + lVar45) = auVar102;
                    *(undefined1 (*) [32])((long)*b_02 + lVar45) = auVar79;
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar60;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar27;
                    auVar102 = vpunpcklqdq_avx(auVar97,auVar73);
                    auVar79 = vpsubq_avx2(auVar120._0_32_,auVar77);
                    uVar28 = auVar79._0_8_;
                    if ((long)auVar79._0_8_ < (long)uVar39) {
                      uVar28 = uVar39;
                    }
                    uVar52 = vpextrq_avx(auVar79._0_16_,1);
                    auVar116 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar68,
                                                   ZEXT116(0) * auVar68 + ZEXT116(1) * auVar102));
                    uVar39 = vpextrq_avx(auVar79._16_16_,1);
                    if ((long)uVar52 < (long)uVar25) {
                      uVar52 = uVar25;
                    }
                    uVar24 = auVar79._16_8_;
                    if ((long)auVar79._16_8_ < (long)uVar67) {
                      uVar24 = uVar67;
                    }
                    if ((long)uVar39 < (long)uVar37) {
                      uVar39 = uVar37;
                    }
                    local_2e0 = auVar78._0_8_;
                    uStack_2d8 = auVar78._8_8_;
                    uStack_2d0 = auVar78._16_8_;
                    uStack_2c8 = auVar78._24_8_;
                    puVar3 = (undefined8 *)((long)*b_03 + lVar45);
                    *puVar3 = local_2e0;
                    puVar3[1] = uStack_2d8;
                    puVar3[2] = uStack_2d0;
                    puVar3[3] = uStack_2c8;
                    *(undefined1 (*) [32])((long)*b_04 + lVar45) = auVar14;
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = uVar39;
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = uVar24;
                    auVar68 = vpunpcklqdq_avx(auVar98,auVar74);
                    auVar14 = vpcmpgtq_avx2(auVar117,auVar79);
                    auVar81 = vblendvpd_avx(auVar119._0_32_,auVar81,auVar14);
                    auVar119 = ZEXT3264(auVar81);
                    auVar81 = vblendvpd_avx(auVar118._0_32_,auVar106,auVar14);
                    auVar118 = ZEXT3264(auVar81);
                    auVar99._8_8_ = 0;
                    auVar99._0_8_ = uVar52;
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = uVar28;
                    auVar102 = vpunpcklqdq_avx(auVar105,auVar99);
                    auVar81 = vpsubq_avx2(auVar122._0_32_,auVar87);
                    auVar81 = vblendvpd_avx(auVar81,auVar93,auVar14);
                    auVar122 = ZEXT3264(auVar81);
                    auVar121._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar102;
                    auVar121._32_32_ = auVar120._32_32_;
                    auVar121._16_16_ = ZEXT116(1) * auVar68;
                    auVar81 = *(undefined1 (*) [32])((long)*ptr + lVar45);
                    auVar106 = *(undefined1 (*) [32])((long)*ptr_00 + lVar45);
                    auVar14 = *(undefined1 (*) [32])((long)*ptr_01 + lVar45);
                    auVar117 = *(undefined1 (*) [32])((long)*ptr_02 + lVar45);
                    lVar45 = lVar45 + 0x20;
                    lVar58 = lVar58 + uVar55 * 4;
                    auVar120 = auVar121;
                  } while (lVar54 != lVar45);
                  auVar14._8_4_ = open;
                  auVar14._0_8_ = uVar34;
                  auVar14._12_4_ = 0;
                  auVar14._16_4_ = open;
                  auVar14._20_4_ = 0;
                  auVar14._24_4_ = open;
                  auVar14._28_4_ = 0;
                  uVar17 = 0;
                  do {
                    uVar28 = (long)iVar47;
                    if (s2_beg == 0) {
                      uVar28 = ptr_04[uVar53 + 1] - uVar34;
                    }
                    auVar106 = vpermpd_avx2((undefined1  [32])ptr[uVar49],0x90);
                    auVar79 = vpermq_avx2(auVar121._0_32_,0x90);
                    auVar117 = auVar119._0_32_;
                    auVar81 = vperm2f128_avx(auVar117,auVar117,8);
                    auVar81 = vpalignr_avx2(auVar117,auVar81,8);
                    auVar119 = ZEXT3264(auVar81);
                    auVar117 = auVar118._0_32_;
                    auVar81 = vperm2f128_avx(auVar117,auVar117,8);
                    auVar81 = vpalignr_avx2(auVar117,auVar81,8);
                    auVar118 = ZEXT3264(auVar81);
                    auVar117 = vpermpd_avx2(auVar122._0_32_,0x90);
                    auVar81 = vblendpd_avx(auVar106,ZEXT832((ulong)ptr_04[uVar53]),1);
                    auVar106 = vpblendd_avx2(auVar79,ZEXT832(uVar28),3);
                    auVar121 = ZEXT3264(auVar106);
                    auVar106 = vblendpd_avx(auVar117,SUB6432(ZEXT864(1),0),1);
                    auVar122 = ZEXT3264(auVar106);
                    lVar45 = 0;
                    lVar58 = lVar59;
                    do {
                      auVar81 = vpaddq_avx2(auVar81,*(undefined1 (*) [32])
                                                     ((long)pvVar9 + lVar45 + lVar36));
                      uVar52 = auVar121._0_8_;
                      uVar28 = *(ulong *)((long)*local_3b0 + lVar45);
                      uVar39 = uVar52;
                      if ((long)uVar52 < (long)uVar28) {
                        uVar39 = uVar28;
                      }
                      uVar24 = vpextrq_avx(auVar121._0_16_,1);
                      uVar28 = *(ulong *)((long)*local_3b0 + lVar45 + 8);
                      if ((long)uVar24 < (long)uVar28) {
                        uVar24 = uVar28;
                      }
                      uVar28 = *(ulong *)((long)*local_3b0 + lVar45 + 0x10);
                      uVar29 = auVar121._16_8_;
                      uVar48 = uVar29;
                      if ((long)uVar29 < (long)uVar28) {
                        uVar48 = uVar28;
                      }
                      auVar82._8_8_ = 0;
                      auVar82._0_8_ = uVar24;
                      auVar89._8_8_ = 0;
                      auVar89._0_8_ = uVar39;
                      auVar68 = vpunpcklqdq_avx(auVar89,auVar82);
                      uVar25 = vpextrq_avx(auVar121._16_16_,1);
                      uVar28 = *(ulong *)((long)*local_3b0 + lVar45 + 0x18);
                      if ((long)uVar25 < (long)uVar28) {
                        uVar25 = uVar28;
                      }
                      auVar90._8_8_ = 0;
                      auVar90._0_8_ = uVar48;
                      auVar79._0_16_ = ZEXT116(0) * auVar90 + ZEXT116(1) * auVar68;
                      auVar79._16_16_ = ZEXT116(1) * auVar90;
                      auVar87._8_8_ = uVar25;
                      auVar87._0_8_ = uVar25;
                      auVar87._16_8_ = uVar25;
                      auVar87._24_8_ = uVar25;
                      auVar87 = vpblendd_avx2(auVar79,auVar87,0xc0);
                      *(undefined1 (*) [32])((long)*local_3b0 + lVar45) = auVar87;
                      auVar80._0_8_ = -(ulong)(auVar87._0_8_ == uVar52);
                      auVar80._8_8_ = -(ulong)(auVar87._8_8_ == auVar121._8_8_);
                      auVar80._16_8_ = -(ulong)(auVar87._16_8_ == uVar29);
                      auVar80._24_8_ = -(ulong)(auVar87._24_8_ == auVar121._24_8_);
                      auVar88._0_8_ = -(ulong)(auVar87._0_8_ == auVar81._0_8_);
                      auVar88._8_8_ = -(ulong)(auVar87._8_8_ == auVar81._8_8_);
                      auVar88._16_8_ = -(ulong)(auVar87._16_8_ == auVar81._16_8_);
                      auVar88._24_8_ = -(ulong)(auVar87._24_8_ == auVar81._24_8_);
                      auVar79 = vpandn_avx2(auVar88,auVar80);
                      auVar106 = vblendvpd_avx(*(undefined1 (*) [32])((long)*local_388 + lVar45),
                                               auVar119._0_32_,auVar79);
                      *(undefined1 (*) [32])((long)*local_388 + lVar45) = auVar106;
                      auVar117 = vblendvpd_avx(*(undefined1 (*) [32])((long)*local_390 + lVar45),
                                               auVar118._0_32_,auVar79);
                      *(undefined1 (*) [32])((long)*local_390 + lVar45) = auVar117;
                      auVar79 = vblendvpd_avx(*(undefined1 (*) [32])((long)*local_3c0 + lVar45),
                                              auVar122._0_32_,auVar79);
                      *(undefined1 (*) [32])((long)*local_3c0 + lVar45) = auVar79;
                      uVar28 = auVar113._0_8_;
                      if ((long)uVar39 <= (long)auVar113._0_8_) {
                        uVar28 = uVar39;
                      }
                      uVar52 = vpextrq_avx(auVar113._0_16_,1);
                      if ((long)uVar24 <= (long)uVar52) {
                        uVar52 = uVar24;
                      }
                      uVar29 = auVar113._16_8_;
                      if ((long)uVar48 <= (long)auVar113._16_8_) {
                        uVar29 = uVar48;
                      }
                      uVar26 = vpextrq_avx(auVar113._16_16_,1);
                      if ((long)uVar25 <= (long)uVar26) {
                        uVar26 = uVar25;
                      }
                      auVar78 = vpcmpeqd_avx2(auVar113._0_32_,auVar113._0_32_);
                      uVar27 = auVar116._0_8_;
                      if ((long)auVar116._0_8_ <= (long)uVar39) {
                        uVar27 = uVar39;
                      }
                      uVar60 = vpextrq_avx(auVar116._0_16_,1);
                      if ((long)uVar60 <= (long)uVar24) {
                        uVar60 = uVar24;
                      }
                      uVar63 = auVar116._16_8_;
                      if ((long)auVar116._16_8_ <= (long)uVar48) {
                        uVar63 = uVar48;
                      }
                      uVar65 = vpextrq_avx(auVar116._16_16_,1);
                      if ((long)uVar65 <= (long)uVar25) {
                        uVar65 = uVar25;
                      }
                      if ((long)uVar27 <= (long)auVar106._0_8_) {
                        uVar27 = auVar106._0_8_;
                      }
                      uVar37 = vpextrq_avx(auVar106._0_16_,1);
                      if ((long)uVar60 <= (long)uVar37) {
                        uVar60 = uVar37;
                      }
                      if ((long)uVar63 <= (long)auVar106._16_8_) {
                        uVar63 = auVar106._16_8_;
                      }
                      uVar37 = vpextrq_avx(auVar106._16_16_,1);
                      if ((long)uVar65 <= (long)uVar37) {
                        uVar65 = uVar37;
                      }
                      if ((long)uVar27 <= (long)auVar117._0_8_) {
                        uVar27 = auVar117._0_8_;
                      }
                      uVar37 = vpextrq_avx(auVar117._0_16_,1);
                      if ((long)uVar60 <= (long)uVar37) {
                        uVar60 = uVar37;
                      }
                      if ((long)uVar63 <= (long)auVar117._16_8_) {
                        uVar63 = auVar117._16_8_;
                      }
                      uVar37 = vpextrq_avx(auVar117._16_16_,1);
                      if ((long)uVar65 <= (long)uVar37) {
                        uVar65 = uVar37;
                      }
                      if ((long)uVar27 <= (long)auVar79._0_8_) {
                        uVar27 = auVar79._0_8_;
                      }
                      uVar37 = vpextrq_avx(auVar79._0_16_,1);
                      if ((long)uVar60 <= (long)uVar37) {
                        uVar60 = uVar37;
                      }
                      if ((long)uVar63 <= (long)auVar79._16_8_) {
                        uVar63 = auVar79._16_8_;
                      }
                      uVar37 = vpextrq_avx(auVar79._16_16_,1);
                      if ((long)uVar65 <= (long)uVar37) {
                        uVar65 = uVar37;
                      }
                      lVar38 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar38 + lVar58) = auVar106._0_4_;
                      lVar38 = lVar38 + lVar58;
                      *(int *)(lVar23 + lVar38) = auVar106._8_4_;
                      *(int *)(lVar64 + lVar38) = auVar106._16_4_;
                      *(int *)(lVar51 + lVar38) = auVar106._24_4_;
                      lVar38 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar38 + lVar58) = auVar117._0_4_;
                      lVar38 = lVar38 + lVar58;
                      *(int *)(lVar23 + lVar38) = auVar117._8_4_;
                      *(int *)(lVar64 + lVar38) = auVar117._16_4_;
                      *(int *)(lVar51 + lVar38) = auVar117._24_4_;
                      lVar38 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar38 + lVar58) = auVar79._0_4_;
                      lVar38 = lVar38 + lVar58;
                      *(int *)(lVar23 + lVar38) = auVar79._8_4_;
                      *(int *)(lVar64 + lVar38) = auVar79._16_4_;
                      *(int *)(lVar51 + lVar38) = auVar79._24_4_;
                      lVar38 = *((ppVar21->field_4).trace)->trace_del_table;
                      *(int *)(lVar38 + lVar58) = (int)uVar39;
                      lVar38 = lVar38 + lVar58;
                      *(int *)(lVar23 + lVar38) = (int)uVar24;
                      *(int *)(lVar64 + lVar38) = (int)uVar48;
                      *(int *)(lVar51 + lVar38) = (int)uVar25;
                      auVar87 = vpsubq_avx2(auVar87,auVar14);
                      auVar93 = vpsubq_avx2(auVar121._0_32_,auVar77);
                      auVar87 = vpcmpgtq_avx2(auVar87,auVar93);
                      uVar50 = ((uint)(SUB321(auVar87 >> 7,0) & 1) |
                                (uint)(SUB321(auVar87 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar87 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar87 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar87 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar87 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar87 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar87 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar87 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar87 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar87 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar87 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar87 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar87 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar87 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar87 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar87 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar87 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar87 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar87 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar87 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar87 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar87 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar87 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar87 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar87 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar87 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar87 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar87 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar87 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar87 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar87[0x1f] >> 7) << 0x1f) ^ 0xffffffff;
                      if (uVar50 == 0) {
                        iVar56 = 0x27;
                      }
                      else {
                        auVar81 = vblendvpd_avx(auVar119._0_32_,auVar106,auVar87);
                        auVar119 = ZEXT3264(auVar81);
                        auVar81 = vblendvpd_avx(auVar118._0_32_,auVar117,auVar87);
                        auVar118 = ZEXT3264(auVar81);
                        auVar81 = vblendvpd_avx(auVar122._0_32_,auVar79,auVar87);
                        auVar81 = vpsubq_avx2(auVar81,auVar78);
                        auVar122 = ZEXT3264(auVar81);
                        auVar81 = *(undefined1 (*) [32])((long)*ptr + lVar45);
                        iVar56 = 0;
                        auVar121 = ZEXT3264(auVar93);
                      }
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = uVar26;
                      auVar83._8_8_ = 0;
                      auVar83._0_8_ = uVar29;
                      auVar68 = vpunpcklqdq_avx(auVar83,auVar75);
                      auVar84._8_8_ = 0;
                      auVar84._0_8_ = uVar52;
                      auVar91._8_8_ = 0;
                      auVar91._0_8_ = uVar28;
                      auVar102 = vpunpcklqdq_avx(auVar91,auVar84);
                      auVar112._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar102;
                      auVar112._16_16_ = ZEXT116(1) * auVar68;
                      auVar113 = ZEXT3264(auVar112);
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = uVar65;
                      auVar85._8_8_ = 0;
                      auVar85._0_8_ = uVar63;
                      auVar68 = vpunpcklqdq_avx(auVar85,auVar76);
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = uVar60;
                      auVar92._8_8_ = 0;
                      auVar92._0_8_ = uVar27;
                      auVar102 = vpunpcklqdq_avx(auVar92,auVar86);
                      auVar115._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar102;
                      auVar115._16_16_ = ZEXT116(1) * auVar68;
                      auVar116._0_32_ = auVar115;
                      if (uVar50 == 0) goto LAB_007c5119;
                      lVar45 = lVar45 + 0x20;
                      lVar58 = lVar58 + uVar55 * 4;
                    } while (lVar54 != lVar45);
                    iVar56 = 0;
LAB_007c5119:
                  } while ((iVar56 == 0) && (bVar66 = uVar17 < 3, uVar17 = uVar17 + 1, bVar66));
                  auVar106 = vpcmpgtq_avx2((undefined1  [32])local_3b0[uVar41],auVar110._0_32_);
                  auVar81 = vblendvpd_avx(auVar110._0_32_,(undefined1  [32])local_3b0[uVar41],
                                          auVar106);
                  auVar68 = auVar81._16_16_;
                  auVar110 = ZEXT3264(auVar81);
                  auVar81 = vblendvpd_avx(auVar108._0_32_,(undefined1  [32])local_388[uVar41],
                                          auVar106);
                  auVar102 = auVar81._16_16_;
                  auVar108 = ZEXT3264(auVar81);
                  auVar81 = vblendvpd_avx(auVar101._0_32_,(undefined1  [32])local_390[uVar41],
                                          auVar106);
                  auVar69 = auVar81._16_16_;
                  auVar101 = ZEXT3264(auVar81);
                  auVar81 = vblendvpd_avx(auVar94._0_32_,(undefined1  [32])local_3c0[uVar41],
                                          auVar106);
                  auVar70 = auVar81._16_16_;
                  auVar94 = ZEXT3264(auVar81);
                  auVar13._8_8_ = -(ulong)(iVar42 == 2);
                  auVar13._0_8_ = -(ulong)(iVar42 == 3);
                  auVar13._16_8_ = -(ulong)(iVar42 == 1);
                  auVar13._24_8_ = -(ulong)(iVar42 == 0);
                  auVar13 = auVar13 & auVar106;
                  if ((((auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar13 >> 0x7f,0) != '\0') || SUB321(auVar13 >> 0xbf,0) != '\0') ||
                      auVar13[0x1f] < '\0') {
                    iVar32 = (int)uVar53;
                  }
                  uVar53 = uVar53 + 1;
                  lVar59 = lVar59 + 4;
                  b_01 = local_3c0;
                  b = local_388;
                  palVar22 = local_3b0;
                  b_00 = local_390;
                  if (uVar53 == uVar44) {
                    if (s2_end == 0) {
                      lVar30 = 0;
                      lVar40 = 0;
                      lVar46 = 0;
                    }
                    else {
                      if (iVar19 < 3) {
                        iVar47 = 1;
                        if (1 < iVar42) {
                          iVar47 = iVar42;
                        }
                        do {
                          auVar81 = auVar110._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar68 = auVar77._16_16_;
                          auVar110 = ZEXT3264(auVar77);
                          auVar81 = auVar108._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar102 = auVar77._16_16_;
                          auVar108 = ZEXT3264(auVar77);
                          auVar81 = auVar101._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar69 = auVar77._16_16_;
                          auVar101 = ZEXT3264(auVar77);
                          auVar81 = auVar94._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar70 = auVar77._16_16_;
                          auVar94 = ZEXT3264(auVar77);
                          iVar47 = iVar47 + -1;
                        } while (iVar47 != 0);
                      }
                      lVar61 = vpextrq_avx(auVar68,1);
                      lVar30 = vpextrq_avx(auVar102,1);
                      lVar40 = vpextrq_avx(auVar69,1);
                      lVar46 = vpextrq_avx(auVar70,1);
                    }
                    iVar43 = (int)lVar46;
                    iVar33 = (int)lVar40;
                    iVar56 = (int)lVar30;
                    iVar47 = iVar18;
                    if ((s1_end != 0) && ((uVar1 & 0x7ffffffc) != 0)) {
                      uVar55 = 0;
                      iVar123 = iVar32;
                      lVar23 = lVar61;
                      do {
                        iVar56 = ((uint)uVar55 & 3) * uVar62 + ((uint)(uVar55 >> 2) & 0x3fffffff);
                        iVar32 = iVar123;
                        lVar61 = lVar23;
                        if (iVar56 < (int)uVar8) {
                          lVar51 = (*local_3b0)[uVar55];
                          lVar61 = lVar51;
                          iVar32 = iVar20;
                          if ((lVar23 < lVar51) ||
                             (((iVar32 = iVar123, lVar61 = lVar23, lVar51 == lVar23 &&
                               (iVar123 == iVar20)) && (iVar56 < iVar47)))) {
                            lVar30 = (*local_388)[uVar55];
                            lVar40 = (*local_390)[uVar55];
                            lVar46 = (*local_3c0)[uVar55];
                            iVar47 = iVar56;
                          }
                        }
                        iVar43 = (int)lVar46;
                        iVar33 = (int)lVar40;
                        iVar56 = (int)lVar30;
                        uVar55 = uVar55 + 1;
                        iVar123 = iVar32;
                        lVar23 = lVar61;
                      } while ((uVar62 & 0x1fffffff) << 2 != (int)uVar55);
                    }
                    iVar123 = (int)lVar61;
                    if (s2_end == 0 && s1_end == 0) {
                      auVar68 = SUB3216(local_3b0[uVar41],0x10);
                      auVar110 = ZEXT3264((undefined1  [32])local_3b0[uVar41]);
                      auVar102 = SUB3216(local_388[uVar41],0x10);
                      auVar108 = ZEXT3264((undefined1  [32])local_388[uVar41]);
                      auVar69 = SUB3216(local_390[uVar41],0x10);
                      auVar101 = ZEXT3264((undefined1  [32])local_390[uVar41]);
                      auVar70 = SUB3216(local_3c0[uVar41],0x10);
                      auVar94 = ZEXT3264((undefined1  [32])local_3c0[uVar41]);
                      if (iVar19 < 3) {
                        iVar32 = 1;
                        if (1 < iVar42) {
                          iVar32 = iVar42;
                        }
                        do {
                          auVar81 = auVar110._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar68 = auVar77._16_16_;
                          auVar110 = ZEXT3264(auVar77);
                          auVar81 = auVar108._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar102 = auVar77._16_16_;
                          auVar108 = ZEXT3264(auVar77);
                          auVar81 = auVar101._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar69 = auVar77._16_16_;
                          auVar101 = ZEXT3264(auVar77);
                          auVar81 = auVar94._0_32_;
                          auVar77 = vperm2i128_avx2(auVar81,auVar81,8);
                          auVar77 = vpalignr_avx2(auVar81,auVar77,8);
                          auVar70 = auVar77._16_16_;
                          auVar94 = ZEXT3264(auVar77);
                          iVar32 = iVar32 + -1;
                        } while (iVar32 != 0);
                      }
                      uVar31 = vpextrq_avx(auVar68,1);
                      iVar123 = (int)uVar31;
                      uVar31 = vpextrq_avx(auVar102,1);
                      iVar56 = (int)uVar31;
                      uVar31 = vpextrq_avx(auVar69,1);
                      iVar33 = (int)uVar31;
                      uVar31 = vpextrq_avx(auVar70,1);
                      iVar43 = (int)uVar31;
                      iVar47 = iVar18;
                      iVar32 = iVar20;
                    }
                    auVar15._8_8_ = lVar35;
                    auVar15._0_8_ = lVar35;
                    auVar15._16_8_ = lVar35;
                    auVar15._24_8_ = lVar35;
                    auVar77 = vpcmpgtq_avx2(auVar15,auVar112);
                    auVar16._8_8_ = lVar57;
                    auVar16._0_8_ = lVar57;
                    auVar16._16_8_ = lVar57;
                    auVar16._24_8_ = lVar57;
                    auVar81 = vpcmpgtq_avx2(auVar115,auVar16);
                    auVar77 = vpor_avx2(auVar81,auVar77);
                    if ((((auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar77 >> 0x7f,0) != '\0') || SUB321(auVar77 >> 0xbf,0) != '\0') ||
                        auVar77[0x1f] < '\0') {
                      *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                      iVar123 = 0;
                      iVar56 = 0;
                      iVar33 = 0;
                      iVar43 = 0;
                      iVar32 = 0;
                      iVar47 = 0;
                    }
                    ppVar21->score = iVar123;
                    ppVar21->end_query = iVar47;
                    ppVar21->end_ref = iVar32;
                    ((ppVar21->field_4).stats)->matches = iVar56;
                    ((ppVar21->field_4).stats)->similar = iVar33;
                    ((ppVar21->field_4).stats)->length = iVar43;
                    parasail_free(ptr_04);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(local_3c0);
                    parasail_free(ptr_01);
                    parasail_free(local_390);
                    parasail_free(ptr_00);
                    parasail_free(local_388);
                    parasail_free(ptr);
                    parasail_free(local_3b0);
                    return ppVar21;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}